

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O0

void compute_deriv(qnode_ptr_t c,qnode_ptr_t f)

{
  int z;
  float fVar1;
  param_t P;
  int k;
  int j;
  int i;
  qnode_ptr_t f_local;
  qnode_ptr_t c_local;
  
  for (k = f->ofst; k < f->sizy - f->ofst; k = k + 1) {
    for (P.err = f->ofst; P.err < f->sizx - f->ofst; P.err = P.err + 1) {
      for (P.cond = 0.0; (int)P.cond < f->sizz; P.cond = (float)((int)P.cond + 1)) {
        fVar1 = dx(c,f,k,P.err,(int)P.cond);
        (*f->param_ptr[(int)P.cond])[f->res * k + P.err].fx = fVar1;
        fVar1 = dy(c,f,k,P.err,(int)P.cond);
        (*f->param_ptr[(int)P.cond])[f->res * k + P.err].fy = fVar1;
      }
    }
  }
  z = (int)((double)c->sizz / 2.0);
  for (k = f->ofst; k < f->sizy - f->ofst; k = k + 1) {
    for (P.err = f->ofst; P.err < f->sizx - f->ofst; P.err = P.err + 1) {
      if ((*f->param_ptr[z])[f->res * k + P.err].err == 0) {
        fVar1 = dt(c,f,k,P.err);
        (*f->param_ptr[z])[f->res * k + P.err].ft = fVar1;
        fVar1 = dxt(f,k,P.err);
        (*f->param_ptr[z])[f->res * k + P.err].fxt = fVar1;
        fVar1 = dyt(f,k,P.err);
        (*f->param_ptr[z])[f->res * k + P.err].fyt = fVar1;
      }
    }
  }
  for (k = f->ofst; k < f->sizy - f->ofst; k = k + 1) {
    for (P.err = f->ofst; P.err < f->sizx - f->ofst; P.err = P.err + 1) {
      if ((*f->param_ptr[z])[f->res * k + P.err].err == 0) {
        fVar1 = dxx(f,k,P.err,z);
        (*f->param_ptr[z])[f->res * k + P.err].fxx = fVar1;
        fVar1 = dyy(f,k,P.err,z);
        (*f->param_ptr[z])[f->res * k + P.err].fyy = fVar1;
        fVar1 = dxy(f,k,P.err,z);
        (*f->param_ptr[z])[f->res * k + P.err].fxy = fVar1;
      }
    }
  }
  return;
}

Assistant:

void compute_deriv(c,f)
qnode_ptr_t c, f ;

{ float dxx(), dyy(), dxy(), dx(), dy(), dt(), dxt(), dyt() ;
  int i, j, k ;
param_t P ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      for (k = 0 ; k < f->sizz ; k++) {
        (*f->param_ptr[k])[f->res*i + j].fx = dx(c,f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fy = dy(c,f,i,j,k) ;
      }
    }
  }
  k = c->sizz/2.0 ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].ft = dt(c,f,i,j) ;
        (*f->param_ptr[k])[f->res*i + j].fxt = dxt(f,i,j) ;
        (*f->param_ptr[k])[f->res*i + j].fyt = dyt(f,i,j) ;
      }
    }
  }
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].fxx = dxx(f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fyy = dyy(f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fxy = dxy(f,i,j,k) ;
      }
    }
  }
}